

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O2

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_AlmostLongDoubleEq_Test::
iu_SyntaxTest_x_iutest_x_AlmostLongDoubleEq_Test
          (iu_SyntaxTest_x_iutest_x_AlmostLongDoubleEq_Test *this)

{
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0039dd10;
  return;
}

Assistant:

IUTEST(SyntaxTest, AlmostLongDoubleEq)
{
    if( long double x = 1.0l )
        IUTEST_ASSERT_ALMOST_EQ(1.0l, x);
    if( long double x = 1.0l )
        IUTEST_EXPECT_ALMOST_EQ(1.0l, x);
    if( long double x = 1.0l )
        IUTEST_INFORM_ALMOST_EQ(1.0l, x);
    if( long double x = 1.0l )
        IUTEST_ASSUME_ALMOST_EQ(1.0l, x);
}